

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

bool __thiscall sc_core::sc_trace_file_base::add_trace_check(sc_trace_file_base *this,string *name)

{
  ostream *poVar1;
  string *in_RSI;
  long in_RDI;
  stringstream ss;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [4];
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  sc_severity in_stack_fffffffffffffe94;
  bool local_1;
  
  local_1 = (*(byte *)(in_RDI + 0xb8) & 1) != 0;
  if (local_1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,"sc_trace() failed:\n\tNo traces can be added to \'");
    poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x98));
    poVar1 = std::operator<<(poVar1,"\' once trace recording has started.\n\tTo add tracing of \'");
    poVar1 = std::operator<<(poVar1,in_RSI);
    std::operator<<(poVar1,"\', create a new trace file.");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sc_report_handler::report
              (in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool
sc_trace_file_base::add_trace_check( const std::string & name ) const
{
    if( !initialized_ ) return true;

    std::stringstream ss;
    ss << "sc_trace() failed:\n"
         "\tNo traces can be added to "
         "'" << filename_  << "'"
         " once trace recording has started.\n"
         "\tTo add tracing of '" << name << "', create a new trace file.";

    SC_REPORT_ERROR( SC_ID_TRACING_ALREADY_INITIALIZED_
                   , ss.str().c_str() );
    return false;
}